

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O2

void __thiscall
wasm::PrintExpressionContents::visitSIMDLoad(PrintExpressionContents *this,SIMDLoad *curr)

{
  ulong uVar1;
  Index IVar2;
  ostream *poVar3;
  Module *in_R8;
  Name name;
  
  prepareColor(this->o);
  if ((ulong)curr->op < 0xc) {
    std::operator<<(this->o,&DAT_00bbf2f0 + *(int *)(&DAT_00bbf2f0 + (ulong)curr->op * 4));
  }
  Colors::normal(this->o);
  name.super_IString.str._M_str = (char *)this->o;
  name.super_IString.str._M_len = (size_t)(curr->memory).super_IString.str._M_str;
  anon_unknown_217::printMemoryName
            ((anon_unknown_217 *)(curr->memory).super_IString.str._M_len,name,(ostream *)this->wasm,
             in_R8);
  if ((curr->offset).addr != 0) {
    poVar3 = std::operator<<(this->o," offset=");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  }
  uVar1 = (curr->align).addr;
  IVar2 = SIMDLoad::getMemBytes(curr);
  if (uVar1 == IVar2) {
    return;
  }
  poVar3 = std::operator<<(this->o," align=");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  return;
}

Assistant:

void visitSIMDLoad(SIMDLoad* curr) {
    prepareColor(o);
    switch (curr->op) {
      case Load8SplatVec128:
        o << "v128.load8_splat";
        break;
      case Load16SplatVec128:
        o << "v128.load16_splat";
        break;
      case Load32SplatVec128:
        o << "v128.load32_splat";
        break;
      case Load64SplatVec128:
        o << "v128.load64_splat";
        break;
      case Load8x8SVec128:
        o << "v128.load8x8_s";
        break;
      case Load8x8UVec128:
        o << "v128.load8x8_u";
        break;
      case Load16x4SVec128:
        o << "v128.load16x4_s";
        break;
      case Load16x4UVec128:
        o << "v128.load16x4_u";
        break;
      case Load32x2SVec128:
        o << "v128.load32x2_s";
        break;
      case Load32x2UVec128:
        o << "v128.load32x2_u";
        break;
      case Load32ZeroVec128:
        o << "v128.load32_zero";
        break;
      case Load64ZeroVec128:
        o << "v128.load64_zero";
        break;
    }
    restoreNormalColor(o);
    printMemoryName(curr->memory, o, wasm);
    if (curr->offset) {
      o << " offset=" << curr->offset;
    }
    if (curr->align != curr->getMemBytes()) {
      o << " align=" << curr->align;
    }
  }